

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_acs.cpp
# Opt level: O2

int DLevelScript::CountPlayers(void)

{
  int iVar1;
  long lVar2;
  
  iVar1 = 0;
  for (lVar2 = 0; lVar2 != 8; lVar2 = lVar2 + 1) {
    iVar1 = iVar1 + (uint)playeringame[lVar2];
  }
  return iVar1;
}

Assistant:

int DLevelScript::CountPlayers ()
{
	int count = 0, i;

	for (i = 0; i < MAXPLAYERS; i++)
		if (playeringame[i])
			count++;

	return count;
}